

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

void store_update(void)

{
  ushort uVar1;
  uint32_t uVar2;
  angband_constants *paVar3;
  void *p;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  if ((player->opts).opt[0x1a] == true) {
    msg("Updating Shops...");
  }
  while (bVar7 = daycount != 0, daycount = daycount - 1, bVar7) {
    lVar6 = 0;
    paVar3 = z_info;
    for (uVar5 = 0; uVar5 < paVar3->store_max; uVar5 = uVar5 + 1) {
      if (*(int *)((long)&stores->feat + lVar6) != 0xe) {
        store_maint((store_conflict *)((long)&stores->owners + lVar6));
        paVar3 = z_info;
      }
      lVar6 = lVar6 + 0x70;
    }
    uVar2 = Rand_div((uint)paVar3->store_shuffle);
    if (uVar2 == 0) {
      p = mem_zalloc((ulong)z_info->store_max << 2);
      if ((player->opts).opt[0x1a] == true) {
        msg("Shuffling a Shopkeeper...");
      }
      uVar1 = z_info->store_max;
      piVar4 = &stores->feat;
      uVar2 = 0;
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        if (*piVar4 != 0xe) {
          *(int *)((long)p + (long)(int)uVar2 * 4) = (int)uVar5;
          uVar2 = uVar2 + 1;
        }
        piVar4 = piVar4 + 0x1c;
      }
      if (0 < (int)uVar2) {
        uVar2 = Rand_div(uVar2);
        store_shuffle(stores + *(int *)((long)p + (long)(int)uVar2 * 4));
      }
      mem_free(p);
    }
  }
  daycount = 0;
  if ((player->opts).opt[0x1a] != true) {
    return;
  }
  msg("Done.");
  return;
}

Assistant:

void store_update(void)
{
	if (OPT(player, cheat_xtra)) msg("Updating Shops...");
	while (daycount--) {
		int n;

		/* Maintain each shop (except home) */
		for (n = 0; n < z_info->store_max; n++) {
			/* Skip the home */
			if (stores[n].feat == FEAT_HOME) continue;

			/* Maintain */
			store_maint(&stores[n]);
		}

		/* Sometimes, shuffle the shop-keepers */
		if (one_in_(z_info->store_shuffle)) {
			int *non_home_inds = mem_zalloc(z_info->store_max
				* sizeof(*non_home_inds));
			int n_without_home = 0;

			/* Message */
			if (OPT(player, cheat_xtra)) msg("Shuffling a Shopkeeper...");

			/* Pick a random shop (except home) */
			for (n = 0; n < z_info->store_max; n++) {
				if (stores[n].feat != FEAT_HOME) {
					non_home_inds[n_without_home] = n;
					++n_without_home;
				}
			}
			if (n_without_home > 0) {
				n = randint0(n_without_home);
				/* Then suffle it. */
				store_shuffle(&stores[non_home_inds[n]]);
			}
			mem_free(non_home_inds);
		}
	}
	daycount = 0;
	if (OPT(player, cheat_xtra)) msg("Done.");
}